

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O0

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ellipses::cleanup_center_points
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *points,Mat *img,bool debug)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  bool bVar3;
  initializer_list<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> __l;
  size_type sVar4;
  undefined8 uVar5;
  unsigned_long *puVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_318;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_2c8;
  const_iterator local_2c0;
  const_iterator local_2b8;
  Point_<int> *local_2b0;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_2a8;
  anon_class_24_3_0db9be0b_for__M_pred local_2a0;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_288;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_280;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_278;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  it;
  Point center;
  double upper_threshold;
  double lower_threshold;
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [32];
  Scalar_<double> local_1f0;
  _InputOutputArray local_1d0;
  Point_<int> local_1b8;
  Scalar_<double> local_1b0;
  allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> local_189;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_188;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_180;
  undefined1 local_168 [40];
  _InputArray local_140;
  _InputOutputArray local_128;
  Mat local_110 [8];
  Mat tmp;
  _InputArray local_a0;
  undefined1 local_84 [28];
  double upper_start;
  double lower_start;
  double step;
  size_t max_iteration;
  size_t iteration;
  RotatedRect ellipse;
  ptrdiff_t erase_count;
  bool debug_local;
  Mat *img_local;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *points_local;
  
  ellipse.size.height = 0.0;
  ellipse.angle = 0.0;
  cv::RotatedRect::RotatedRect((RotatedRect *)((long)&iteration + 4));
  max_iteration = 0;
  step = 3.95252516672997e-323;
  lower_start = 0.03;
  upper_start = 0.24;
  local_84._20_8_ = 0x3fea3d70a3d70a3d;
  while( true ) {
    bVar3 = false;
    if (max_iteration < 0xc) {
      sVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(points);
      bVar3 = 5 < sVar4;
    }
    if (!bVar3) break;
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_a0,points);
    cv::fitEllipse((_InputArray *)local_84);
    cv::RotatedRect::operator=((RotatedRect *)((long)&iteration + 4),(RotatedRect *)local_84);
    cv::_InputArray::~_InputArray(&local_a0);
    if (debug) {
      cv::Mat::clone();
      cv::_InputOutputArray::_InputOutputArray(&local_128,local_110);
      local_188 = &local_180;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(local_188,points);
      local_168._0_8_ = &local_180;
      local_168._8_8_ = (pointer)0x1;
      std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>::allocator
                (&local_189);
      __l._M_len = local_168._8_8_;
      __l._M_array = (iterator)local_168._0_8_;
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)(local_168 + 0x10),__l,&local_189);
      cv::_InputArray::_InputArray<cv::Point_<int>>
                (&local_140,
                 (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  *)(local_168 + 0x10));
      cv::Scalar_<double>::Scalar_(&local_1b0,255.0,0.0,0.0,0.0);
      uVar5 = cv::noArray();
      cv::Point_<int>::Point_(&local_1b8);
      cv::drawContours(&local_128,&local_140,0,&local_1b0,3,8,uVar5,0x7fffffff,&local_1b8);
      cv::_InputArray::~_InputArray(&local_140);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 *)(local_168 + 0x10));
      std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>::~allocator
                (&local_189);
      local_318 = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_168;
      do {
        local_318 = local_318 + -1;
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(local_318);
      } while (local_318 != &local_180);
      cv::_InputOutputArray::~_InputOutputArray(&local_128);
      cv::_InputOutputArray::_InputOutputArray(&local_1d0,local_110);
      cv::Scalar_<double>::Scalar_(&local_1f0,0.0,255.0,0.0,0.0);
      cv::ellipse(&local_1d0,(RotatedRect *)((long)&iteration + 4),(Scalar_ *)&local_1f0,3,8);
      cv::_InputOutputArray::~_InputOutputArray(&local_1d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_210,"Cleanup",&local_211);
      cv::namedWindow(local_210,0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_238,"Cleanup",&local_239);
      cv::_InputArray::_InputArray((_InputArray *)&lower_threshold,local_110);
      cv::imshow(local_238,(_InputArray *)&lower_threshold);
      cv::_InputArray::~_InputArray((_InputArray *)&lower_threshold);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
      cv::waitKey(0);
      cv::destroyAllWindows();
      cv::Mat::~Mat(local_110);
    }
    dVar7 = (double)ellipse.center.x;
    puVar6 = std::min<unsigned_long>(&max_iteration,(unsigned_long *)&step);
    uVar1 = *puVar6;
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    dVar8 = (double)ellipse.center.x;
    puVar6 = std::min<unsigned_long>(&max_iteration,(unsigned_long *)&step);
    uVar2 = *puVar6;
    auVar10._8_4_ = (int)(uVar2 >> 0x20);
    auVar10._0_8_ = uVar2;
    auVar10._12_4_ = 0x45300000;
    cv::Point_::operator_cast_to_Point_((Point_ *)&it);
    local_280._M_current =
         (Point_<int> *)
         std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin(points);
    local_288._M_current =
         (Point_<int> *)std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end(points)
    ;
    cv::Point_<int>::Point_(&local_2a0.center,(Point_<int> *)&it);
    local_2a0.lower_threshold =
         dVar7 * (((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.03 + 0.24);
    local_2a0.upper_threshold =
         dVar8 * (((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * -0.03 + 0.82);
    local_2a8 = std::
                remove_if<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                          (local_280,local_288,&local_2a0);
    local_278 = local_2a8;
    local_2b0 = (Point_<int> *)
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end(points);
    ellipse._12_8_ =
         std::
         distance<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                   (local_2a8,
                    (__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                     )local_2b0);
    __gnu_cxx::
    __normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
    ::__normal_iterator<cv::Point_<int>*>
              ((__normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                *)&local_2b8,&local_278);
    local_2c8._M_current =
         (Point_<int> *)std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end(points)
    ;
    __gnu_cxx::
    __normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
    ::__normal_iterator<cv::Point_<int>*>
              ((__normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                *)&local_2c0,&local_2c8);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::erase
              (points,local_2b8,local_2c0);
    max_iteration = max_iteration + 1;
  }
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (__return_storage_ptr__,points);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Point> cleanup_center_points(std::vector<cv::Point> points, const cv::Mat& img, bool debug)
{
    std::ptrdiff_t erase_count = 0;
    cv::RotatedRect ellipse;
    std::size_t iteration = 0;
    const constexpr std::size_t max_iteration = 8;
    const constexpr double step = 0.03;
    const constexpr double lower_start = 0.48 - (step * double(max_iteration));
    const constexpr double upper_start = 0.58 + (step * double(max_iteration));
    while(iteration < 12 && points.size() > 5)
    {
        ellipse = cv::fitEllipse(points);

        if(debug)
        {
            auto tmp = img.clone();
            cv::drawContours(tmp, std::vector<std::vector<cv::Point>> {points}, 0, cv::Scalar(255, 0, 0), 3);
            cv::ellipse(tmp, ellipse, cv::Scalar(0, 255, 0), 3);
            cv::namedWindow("Cleanup", cv::WINDOW_NORMAL);
            cv::imshow("Cleanup", tmp);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }

        auto lower_threshold = ellipse.size.width * (lower_start + step * std::min(iteration, max_iteration));
        auto upper_threshold = ellipse.size.width * (upper_start - step * std::min(iteration, max_iteration));

        cv::Point center = ellipse.center;

        auto it = std::remove_if(
            points.begin(), points.end(), [center, lower_threshold, upper_threshold](const cv::Point& p) {
                auto dis = euclideanDistance(p, center);
                return dis < lower_threshold || dis > upper_threshold;
            });
        erase_count = std::distance(it, points.end());
        points.erase(it, points.end());
        iteration++;
    }
    return points;
}